

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void duckdb::ConstantVector::Reference(Vector *vector,Vector *source,idx_t position,idx_t count)

{
  uint64_t uVar1;
  uint64_t uVar2;
  PhysicalType PVar3;
  bool bVar4;
  LogicalType *this;
  list_entry_t *plVar5;
  idx_t iVar6;
  Vector *this_00;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *pvVar7;
  size_type sVar8;
  Vector *in_RCX;
  Vector *in_RDX;
  Vector *in_RSI;
  Value value;
  idx_t i_1;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *target_entries;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *source_entries;
  Value null_value_2;
  idx_t struct_index;
  UnifiedVectorFormat vdata_2;
  idx_t i;
  SelectionVector sel;
  idx_t array_size;
  Vector *source_child;
  Vector *target_child;
  Value null_value_1;
  idx_t source_idx;
  UnifiedVectorFormat vdata_1;
  Vector *child;
  list_entry_t *target_data;
  list_entry_t list_entry;
  list_entry_t *list_data;
  Value null_value;
  idx_t list_index;
  UnifiedVectorFormat vdata;
  LogicalType *source_type;
  Vector *in_stack_fffffffffffffc28;
  type in_stack_fffffffffffffc30;
  Vector *in_stack_fffffffffffffc38;
  type in_stack_fffffffffffffc40;
  idx_t in_stack_fffffffffffffc48;
  SelectionVector *in_stack_fffffffffffffc50;
  ulong uVar9;
  undefined8 in_stack_fffffffffffffc58;
  VectorType VVar10;
  Vector *in_stack_fffffffffffffc60;
  Vector *this_01;
  Vector *in_stack_fffffffffffffc78;
  Vector *in_stack_fffffffffffffc80;
  UnifiedVectorFormat *in_stack_fffffffffffffcf0;
  idx_t in_stack_fffffffffffffcf8;
  UnifiedVectorFormat *count_00;
  undefined7 in_stack_fffffffffffffd00;
  ulong local_2b8;
  Value *in_stack_fffffffffffffda8;
  Vector *in_stack_fffffffffffffdb0;
  SelectionVector *local_240;
  ulong local_1f8;
  idx_t in_stack_fffffffffffffe40;
  SelectionVector *in_stack_fffffffffffffe48;
  Vector *in_stack_fffffffffffffe50;
  SelectionVector *local_160;
  UnifiedVectorFormat local_70;
  
  this = Vector::GetType(in_RSI);
  PVar3 = LogicalType::InternalType(this);
  VVar10 = (VectorType)((ulong)in_stack_fffffffffffffc58 >> 0x38);
  if (PVar3 == LIST) {
    count_00 = &local_70;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffc40);
    Vector::ToUnifiedFormat
              ((Vector *)CONCAT17(PVar3,in_stack_fffffffffffffd00),(idx_t)count_00,
               in_stack_fffffffffffffcf0);
    iVar6 = SelectionVector::get_index(local_70.sel,(idx_t)in_RDX);
    bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffc38,
                       (idx_t)in_stack_fffffffffffffc30);
    if (bVar4) {
      plVar5 = UnifiedVectorFormat::GetData<duckdb::list_entry_t>(&local_70);
      uVar1 = plVar5[iVar6].offset;
      uVar2 = plVar5[iVar6].length;
      plVar5 = FlatVector::GetData<duckdb::list_entry_t>((Vector *)0x3e4347);
      plVar5->offset = uVar1;
      plVar5->length = uVar2;
      ListVector::GetEntry((Vector *)0x3e4381);
      ListVector::GetEntry((Vector *)0x3e43b8);
      Vector::Reference(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      ListVector::GetListSize(in_stack_fffffffffffffc28);
      ListVector::SetListSize(in_stack_fffffffffffffc30,(idx_t)in_stack_fffffffffffffc28);
      Vector::SetVectorType(in_stack_fffffffffffffc60,VVar10);
    }
    else {
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffffc30,(LogicalType *)in_stack_fffffffffffffc28);
      Value::Value((Value *)in_stack_fffffffffffffc40,(LogicalType *)in_stack_fffffffffffffc38);
      LogicalType::~LogicalType((LogicalType *)0x3e425a);
      Vector::Reference(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      Value::~Value((Value *)in_stack_fffffffffffffc30);
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffc30);
  }
  else if (PVar3 == STRUCT) {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffc40);
    Vector::ToUnifiedFormat
              ((Vector *)CONCAT17(PVar3,in_stack_fffffffffffffd00),in_stack_fffffffffffffcf8,
               in_stack_fffffffffffffcf0);
    SelectionVector::get_index(local_240,(idx_t)in_RDX);
    bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffc38,
                       (idx_t)in_stack_fffffffffffffc30);
    if (bVar4) {
      this_00 = (Vector *)StructVector::GetEntries(in_stack_fffffffffffffc28);
      this_01 = this_00;
      pvVar7 = StructVector::GetEntries(in_stack_fffffffffffffc28);
      local_2b8 = 0;
      while( true ) {
        uVar9 = local_2b8;
        sVar8 = ::std::
                vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                ::size((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                        *)this_00);
        if (sVar8 <= uVar9) break;
        vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
        ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                      *)in_stack_fffffffffffffc30,(size_type)in_stack_fffffffffffffc28);
        in_stack_fffffffffffffc40 =
             unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                        in_stack_fffffffffffffc30);
        in_stack_fffffffffffffc38 =
             (Vector *)
             vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
             ::operator[]((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                           *)in_stack_fffffffffffffc30,(size_type)in_stack_fffffffffffffc28);
        in_stack_fffffffffffffc30 =
             unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                       ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                        in_stack_fffffffffffffc30);
        Reference(in_RSI,in_RDX,(idx_t)in_RCX,(idx_t)this);
        local_2b8 = local_2b8 + 1;
      }
      Vector::SetVectorType(this_01,(VectorType)((ulong)pvVar7 >> 0x38));
      TemplatedValidityMask<unsigned_long>::Set
                ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffc40,
                 (idx_t)in_stack_fffffffffffffc38,SUB81((ulong)in_stack_fffffffffffffc30 >> 0x38,0))
      ;
    }
    else {
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffffc30,(LogicalType *)in_stack_fffffffffffffc28);
      Value::Value((Value *)in_stack_fffffffffffffc40,(LogicalType *)in_stack_fffffffffffffc38);
      LogicalType::~LogicalType((LogicalType *)0x3e482c);
      Vector::Reference(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      Value::~Value((Value *)in_stack_fffffffffffffc30);
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffc30);
  }
  else if (PVar3 == ARRAY) {
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffc40);
    Vector::ToUnifiedFormat
              ((Vector *)CONCAT17(PVar3,in_stack_fffffffffffffd00),in_stack_fffffffffffffcf8,
               in_stack_fffffffffffffcf0);
    SelectionVector::get_index(local_160,(idx_t)in_RDX);
    bVar4 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffc38,
                       (idx_t)in_stack_fffffffffffffc30);
    if (bVar4) {
      ArrayVector::GetEntry((Vector *)0x3e45c1);
      ArrayVector::GetEntry((Vector *)0x3e45e2);
      Vector::Reference(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78);
      iVar6 = ArrayType::GetSize((LogicalType *)in_stack_fffffffffffffc30);
      SelectionVector::SelectionVector(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      for (local_1f8 = 0; VVar10 = (VectorType)((ulong)in_stack_fffffffffffffc58 >> 0x38),
          local_1f8 < iVar6; local_1f8 = local_1f8 + 1) {
        SelectionVector::set_index
                  ((SelectionVector *)in_stack_fffffffffffffc40,(idx_t)in_stack_fffffffffffffc38,
                   (idx_t)in_stack_fffffffffffffc30);
      }
      Vector::Slice(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
      Vector::Flatten(in_RCX,(idx_t)this);
      Vector::SetVectorType(in_stack_fffffffffffffc60,VVar10);
      TemplatedValidityMask<unsigned_long>::Set
                ((TemplatedValidityMask<unsigned_long> *)in_stack_fffffffffffffc40,
                 (idx_t)in_stack_fffffffffffffc38,SUB81((ulong)in_stack_fffffffffffffc30 >> 0x38,0))
      ;
      SelectionVector::~SelectionVector((SelectionVector *)0x3e474d);
    }
    else {
      LogicalType::LogicalType
                ((LogicalType *)in_stack_fffffffffffffc30,(LogicalType *)in_stack_fffffffffffffc28);
      Value::Value((Value *)in_stack_fffffffffffffc40,(LogicalType *)in_stack_fffffffffffffc38);
      LogicalType::~LogicalType((LogicalType *)0x3e451b);
      Vector::Reference(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      Value::~Value((Value *)in_stack_fffffffffffffc30);
    }
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffc30);
  }
  else {
    Vector::GetValue(in_stack_fffffffffffffc38,(idx_t)in_stack_fffffffffffffc30);
    Vector::Reference(in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    Value::~Value((Value *)in_stack_fffffffffffffc30);
  }
  return;
}

Assistant:

void ConstantVector::Reference(Vector &vector, Vector &source, idx_t position, idx_t count) {
	auto &source_type = source.GetType();
	switch (source_type.InternalType()) {
	case PhysicalType::LIST: {
		// retrieve the list entry from the source vector
		UnifiedVectorFormat vdata;
		source.ToUnifiedFormat(count, vdata);

		auto list_index = vdata.sel->get_index(position);
		if (!vdata.validity.RowIsValid(list_index)) {
			// list is null: create null value
			Value null_value(source_type);
			vector.Reference(null_value);
			break;
		}

		auto list_data = UnifiedVectorFormat::GetData<list_entry_t>(vdata);
		auto list_entry = list_data[list_index];

		// add the list entry as the first element of "vector"
		// FIXME: we only need to allocate space for 1 tuple here
		auto target_data = FlatVector::GetData<list_entry_t>(vector);
		target_data[0] = list_entry;

		// create a reference to the child list of the source vector
		auto &child = ListVector::GetEntry(vector);
		child.Reference(ListVector::GetEntry(source));

		ListVector::SetListSize(vector, ListVector::GetListSize(source));
		vector.SetVectorType(VectorType::CONSTANT_VECTOR);
		break;
	}
	case PhysicalType::ARRAY: {
		UnifiedVectorFormat vdata;
		source.ToUnifiedFormat(count, vdata);
		auto source_idx = vdata.sel->get_index(position);
		if (!vdata.validity.RowIsValid(source_idx)) {
			// list is null: create null value
			Value null_value(source_type);
			vector.Reference(null_value);
			break;
		}

		// Reference the child vector
		auto &target_child = ArrayVector::GetEntry(vector);
		auto &source_child = ArrayVector::GetEntry(source);
		target_child.Reference(source_child);

		// Only take the element at the given position
		auto array_size = ArrayType::GetSize(source_type);
		SelectionVector sel(array_size);
		for (idx_t i = 0; i < array_size; i++) {
			sel.set_index(i, array_size * source_idx + i);
		}
		target_child.Slice(sel, array_size);
		target_child.Flatten(array_size); // since its constant we only have to flatten this much

		vector.SetVectorType(VectorType::CONSTANT_VECTOR);
		vector.validity.Set(0, true);
		break;
	}
	case PhysicalType::STRUCT: {
		UnifiedVectorFormat vdata;
		source.ToUnifiedFormat(count, vdata);

		auto struct_index = vdata.sel->get_index(position);
		if (!vdata.validity.RowIsValid(struct_index)) {
			// null struct: create null value
			Value null_value(source_type);
			vector.Reference(null_value);
			break;
		}

		// struct: pass constant reference into child entries
		auto &source_entries = StructVector::GetEntries(source);
		auto &target_entries = StructVector::GetEntries(vector);
		for (idx_t i = 0; i < source_entries.size(); i++) {
			ConstantVector::Reference(*target_entries[i], *source_entries[i], position, count);
		}
		vector.SetVectorType(VectorType::CONSTANT_VECTOR);
		vector.validity.Set(0, true);
		break;
	}
	default:
		// default behavior: get a value from the vector and reference it
		// this is not that expensive for scalar types
		auto value = source.GetValue(position);
		vector.Reference(value);
		D_ASSERT(vector.GetVectorType() == VectorType::CONSTANT_VECTOR);
		break;
	}
}